

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

int __thiscall
FNodeBuilder::SelectSplitter
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg,int step,bool nosplit)

{
  byte bVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  FPrivSeg *pseg;
  byte bVar11;
  DWORD DVar12;
  uint local_4c;
  int local_44;
  
  bVar11 = 0;
  memset((this->PlaneChecked).Array,0,(ulong)(this->PlaneChecked).Count);
  local_4c = 0xffffffff;
  iVar9 = 1;
  local_44 = 0;
  iVar7 = 0;
  DVar12 = set;
  do {
    if (DVar12 == 0xffffffff) {
      if (local_4c == 0xffffffff) {
        iVar9 = -(uint)bVar11;
      }
      else {
        *splitseg = local_4c;
        SetNodeFromSeg(this,node,(this->Segs).Array + local_4c);
      }
      return iVar9;
    }
    pseg = (this->Segs).Array + DVar12;
    iVar5 = iVar7 + -1;
    bVar3 = iVar7 < 2;
    iVar7 = iVar5;
    uVar4 = local_4c;
    iVar5 = local_44;
    if (bVar3) {
      uVar10 = pseg->planenum >> 3;
      uVar8 = 1 << ((byte)pseg->planenum & 7);
      if (-1 < (int)uVar10) {
        puVar2 = (this->PlaneChecked).Array;
        bVar1 = puVar2[uVar10];
        if ((uVar8 & bVar1) != 0) goto LAB_004707b8;
        puVar2[uVar10] = (byte)uVar8 | bVar1;
      }
      SetNodeFromSeg(this,node,pseg);
      iVar6 = Heuristic(this,node,set,nosplit);
      iVar7 = step;
      uVar4 = DVar12;
      iVar5 = iVar6;
      if ((iVar6 <= local_44) && (uVar4 = local_4c, iVar5 = local_44, iVar6 < 0)) {
        bVar11 = 1;
      }
    }
LAB_004707b8:
    local_44 = iVar5;
    local_4c = uVar4;
    DVar12 = pseg->next;
  } while( true );
}

Assistant:

int FNodeBuilder::SelectSplitter (DWORD set, node_t &node, DWORD &splitseg, int step, bool nosplit)
{
	int stepleft;
	int bestvalue;
	DWORD bestseg;
	DWORD seg;
	bool nosplitters = false;

	bestvalue = 0;
	bestseg = DWORD_MAX;

	seg = set;
	stepleft = 0;

	memset (&PlaneChecked[0], 0, PlaneChecked.Size());

	D(Printf (PRINT_LOG, "Processing set %d\n", set));

	while (seg != DWORD_MAX)
	{
		FPrivSeg *pseg = &Segs[seg];

		if (--stepleft <= 0)
		{
			int l = pseg->planenum >> 3;
			int r = 1 << (pseg->planenum & 7);

			if (l < 0 || (PlaneChecked[l] & r) == 0)
			{
				if (l >= 0)
				{
					PlaneChecked[l] |= r;
				}

				stepleft = step;
				SetNodeFromSeg (node, pseg);

				int value = Heuristic (node, set, nosplit);

				D(Printf (PRINT_LOG, "Seg %5d, ld %d (%5d,%5d)-(%5d,%5d) scores %d\n", seg, Segs[seg].linedef, node.x>>16, node.y>>16,
					(node.x+node.dx)>>16, (node.y+node.dy)>>16, value));

				if (value > bestvalue)
				{
					bestvalue = value;
					bestseg = seg;
				}
				else if (value < 0)
				{
					nosplitters = true;
				}
			}
		}

		seg = pseg->next;
	}

	if (bestseg == DWORD_MAX)
	{ // No lines split any others into two sets, so this is a convex region.
	D(Printf (PRINT_LOG, "set %d, step %d, nosplit %d has no good splitter (%d)\n", set, step, nosplit, nosplitters));
		return nosplitters ? -1 : 0;
	}

	D(Printf (PRINT_LOG, "split seg %u in set %d, score %d, step %d, nosplit %d\n", bestseg, set, bestvalue, step, nosplit));

	splitseg = bestseg;
	SetNodeFromSeg (node, &Segs[bestseg]);
	return 1;
}